

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::FieldMaskUtil::SnakeCaseToCamelCase
          (FieldMaskUtil *this,string_view input,string *output)

{
  char cVar1;
  bool bVar2;
  const_iterator pvVar3;
  char input_char;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  bool after_underscore;
  string *output_local;
  string_view input_local;
  
  input_local._M_len = input._M_len;
  output_local = (string *)this;
  std::__cxx11::string::clear();
  bVar2 = false;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&output_local);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&output_local);
  while( true ) {
    if (__end2 == pvVar3) {
      return !bVar2;
    }
    cVar1 = *__end2;
    if (('@' < cVar1) && (cVar1 < '[')) break;
    if (bVar2) {
      if ((cVar1 < 'a') || ('z' < cVar1)) {
        return false;
      }
      std::__cxx11::string::push_back((char)input._M_str);
      bVar2 = false;
    }
    else if (cVar1 == '_') {
      bVar2 = true;
    }
    else {
      std::__cxx11::string::push_back((char)input._M_str);
    }
    __end2 = __end2 + 1;
  }
  return false;
}

Assistant:

bool FieldMaskUtil::SnakeCaseToCamelCase(absl::string_view input,
                                         std::string* output) {
  output->clear();
  bool after_underscore = false;
  for (char input_char : input) {
    if (input_char >= 'A' && input_char <= 'Z') {
      // The field name must not contain uppercase letters.
      return false;
    }
    if (after_underscore) {
      if (input_char >= 'a' && input_char <= 'z') {
        output->push_back(input_char + 'A' - 'a');
        after_underscore = false;
      } else {
        // The character after a "_" must be a lowercase letter.
        return false;
      }
    } else if (input_char == '_') {
      after_underscore = true;
    } else {
      output->push_back(input_char);
    }
  }
  if (after_underscore) {
    // Trailing "_".
    return false;
  }
  return true;
}